

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<unsigned_long&,int>(FileLoc *loc,char *fmt,unsigned_long *args,int *args_1)

{
  char *in_stack_ffffffffffffff98;
  FileLoc *loc_00;
  int *in_stack_ffffffffffffffb8;
  unsigned_long *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  loc_00 = (FileLoc *)&stack0xffffffffffffffc0;
  StringPrintf<unsigned_long&,int>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::c_str();
  ErrorExit(loc_00,in_stack_ffffffffffffff98);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}